

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_putrid_air(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RCX;
  CHAR_DATA *in_RDX;
  __type_conflict2 _Var5;
  CHAR_DATA *vch_next;
  CHAR_DATA *vch;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *format;
  CHAR_DATA *local_28;
  
  if ((in_RDX->in_room->sector_type != 0) && (in_RDX->in_room->sector_type == 8)) {
    send_to_char(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    return;
  }
  act(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
      (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
      in_stack_ffffffffffffffb8,0);
  format = in_RDX->in_room->people;
LAB_006e2b62:
  do {
    local_28 = format;
    if (local_28 == (CHAR_DATA *)0x0) {
      return;
    }
    format = local_28->next_in_room;
    bVar1 = is_affected(local_28,(int)gsn_ultradiffusion);
  } while (bVar1);
  bVar1 = is_npc(in_stack_ffffffffffffffb8);
  if (bVar1) goto LAB_006e2bab;
  goto LAB_006e2be3;
LAB_006e2bab:
  in_stack_ffffffffffffffc8 = (CHAR_DATA *)local_28->form[0];
  _Var5 = std::pow<int,int>(0,0x6e2bcb);
  if (((ulong)in_stack_ffffffffffffffc8 & (long)_Var5) != 0) {
LAB_006e2be3:
    if (local_28 != in_RDX) {
      iVar2 = number_percent();
      iVar3 = get_curr_stat(in_RDX,(int)((ulong)in_RCX >> 0x20));
      iVar4 = (iVar3 + -0xf) * 10;
      if (iVar2 != iVar4 && SBORROW4(iVar2,iVar4) == iVar2 + (iVar3 + -0xf) * -10 < 0) {
        do_visible((CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                   (char *)in_stack_ffffffffffffffb8);
        act((char *)format,in_stack_ffffffffffffffc8,
            (void *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0);
        act((char *)format,in_stack_ffffffffffffffc8,
            (void *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0);
      }
    }
  }
  goto LAB_006e2b62;
}

Assistant:

void spell_putrid_air(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *vch, *vch_next;

	if (ch->in_room->sector_type && ch->in_room->sector_type == SECT_UNDERWATER)
	{
		send_to_char("You cannot cast this here.\n\r", ch);
		return;
	}

	act("A wave of putrid air sweeps through the area!", ch, 0, 0, TO_ALL);

	for (vch = ch->in_room->people; vch != nullptr; vch = vch_next)
	{
		vch_next = vch->next_in_room;

		if (is_affected(vch, gsn_ultradiffusion))
			continue;

		if (is_npc(vch) && !IS_SET(vch->form, FORM_BIPED))
			continue;

		if (vch == ch)
			continue;

		if (number_percent() > 10 * (get_curr_stat(vch, STAT_CON) - 15))
		{
			do_visible(vch, "");
			act("You burst out in a fit of coughing.", vch, nullptr, nullptr, TO_CHAR);
			act("$n bursts out in a fit of coughing.", vch, nullptr, nullptr, TO_ROOM);
		}
	}
}